

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall sf::RenderTarget::applyBlendMode(RenderTarget *this,BlendMode *mode)

{
  Equation EVar1;
  Factor FVar2;
  Factor FVar3;
  _func_void_GLenum *p_Var4;
  _func_void_GLenum_GLenum_GLenum_GLenum *p_Var5;
  _func_void_GLenum_GLenum *p_Var6;
  Uint32 UVar7;
  Uint32 UVar8;
  Uint32 UVar9;
  Uint32 UVar10;
  ostream *poVar11;
  char *pcVar12;
  uint uVar13;
  
  p_Var5 = sf_ptrc_glBlendFuncSeparateEXT;
  if (sfogl_ext_EXT_blend_func_separate == 0) {
    UVar7 = anon_unknown.dwarf_da44d::factorToGlConstant(mode->colorSrcFactor);
    UVar8 = anon_unknown.dwarf_da44d::factorToGlConstant(mode->colorDstFactor);
    glBlendFunc(UVar7,UVar8);
    pcVar12 = 
    "glBlendFunc( factorToGlConstant(mode.colorSrcFactor), factorToGlConstant(mode.colorDstFactor))"
    ;
    uVar13 = 0x24e;
  }
  else {
    UVar7 = anon_unknown.dwarf_da44d::factorToGlConstant(mode->colorSrcFactor);
    UVar8 = anon_unknown.dwarf_da44d::factorToGlConstant(mode->colorDstFactor);
    UVar9 = anon_unknown.dwarf_da44d::factorToGlConstant(mode->alphaSrcFactor);
    UVar10 = anon_unknown.dwarf_da44d::factorToGlConstant(mode->alphaDstFactor);
    (*p_Var5)(UVar7,UVar8,UVar9,UVar10);
    pcVar12 = 
    "GLEXT_glBlendFuncSeparate( factorToGlConstant(mode.colorSrcFactor), factorToGlConstant(mode.colorDstFactor), factorToGlConstant(mode.alphaSrcFactor), factorToGlConstant(mode.alphaDstFactor))"
    ;
    uVar13 = 0x248;
  }
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,uVar13,pcVar12);
  p_Var6 = sf_ptrc_glBlendEquationSeparateEXT;
  p_Var4 = sf_ptrc_glBlendEquationEXT;
  if ((sfogl_ext_EXT_blend_minmax == 0) || (sfogl_ext_EXT_blend_subtract == 0)) {
    if ((mode->alphaEquation != Add || mode->colorEquation != Add) &&
       (applyBlendMode(sf::BlendMode_const&)::warned == '\0')) {
      poVar11 = err();
      poVar11 = std::operator<<(poVar11,
                                "OpenGL extension EXT_blend_minmax and/or EXT_blend_subtract unavailable"
                               );
      std::endl<char,std::char_traits<char>>(poVar11);
      poVar11 = err();
      poVar11 = std::operator<<(poVar11,"Selecting a blend equation not possible");
      std::endl<char,std::char_traits<char>>(poVar11);
      poVar11 = err();
      poVar11 = std::operator<<(poVar11,"Ensure that hardware acceleration is enabled if available")
      ;
      std::endl<char,std::char_traits<char>>(poVar11);
      applyBlendMode(sf::BlendMode_const&)::warned = '\x01';
    }
  }
  else {
    if (sfogl_ext_EXT_blend_equation_separate == 0) {
      UVar7 = anon_unknown.dwarf_da44d::equationToGlConstant(mode->colorEquation);
      (*p_Var4)(UVar7);
      pcVar12 = "GLEXT_glBlendEquation(equationToGlConstant(mode.colorEquation))";
      uVar13 = 0x25b;
    }
    else {
      UVar7 = anon_unknown.dwarf_da44d::equationToGlConstant(mode->colorEquation);
      UVar8 = anon_unknown.dwarf_da44d::equationToGlConstant(mode->alphaEquation);
      (*p_Var6)(UVar7,UVar8);
      pcVar12 = 
      "GLEXT_glBlendEquationSeparate( equationToGlConstant(mode.colorEquation), equationToGlConstant(mode.alphaEquation))"
      ;
      uVar13 = 599;
    }
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                       ,uVar13,pcVar12);
  }
  EVar1 = mode->alphaEquation;
  (this->m_cache).lastBlendMode.alphaDstFactor = mode->alphaDstFactor;
  (this->m_cache).lastBlendMode.alphaEquation = EVar1;
  FVar2 = mode->colorDstFactor;
  EVar1 = mode->colorEquation;
  FVar3 = mode->alphaSrcFactor;
  (this->m_cache).lastBlendMode.colorSrcFactor = mode->colorSrcFactor;
  (this->m_cache).lastBlendMode.colorDstFactor = FVar2;
  (this->m_cache).lastBlendMode.colorEquation = EVar1;
  (this->m_cache).lastBlendMode.alphaSrcFactor = FVar3;
  return;
}

Assistant:

void RenderTarget::applyBlendMode(const BlendMode& mode)
{
    // Apply the blend mode, falling back to the non-separate versions if necessary
    if (GLEXT_blend_func_separate)
    {
        glCheck(GLEXT_glBlendFuncSeparate(
            factorToGlConstant(mode.colorSrcFactor), factorToGlConstant(mode.colorDstFactor),
            factorToGlConstant(mode.alphaSrcFactor), factorToGlConstant(mode.alphaDstFactor)));
    }
    else
    {
        glCheck(glBlendFunc(
            factorToGlConstant(mode.colorSrcFactor),
            factorToGlConstant(mode.colorDstFactor)));
    }

    if (GLEXT_blend_minmax && GLEXT_blend_subtract)
    {
        if (GLEXT_blend_equation_separate)
        {
            glCheck(GLEXT_glBlendEquationSeparate(
                equationToGlConstant(mode.colorEquation),
                equationToGlConstant(mode.alphaEquation)));
        }
        else
        {
            glCheck(GLEXT_glBlendEquation(equationToGlConstant(mode.colorEquation)));
        }
    }
    else if ((mode.colorEquation != BlendMode::Add) || (mode.alphaEquation != BlendMode::Add))
    {
        static bool warned = false;

        if (!warned)
        {
            err() << "OpenGL extension EXT_blend_minmax and/or EXT_blend_subtract unavailable" << std::endl;
            err() << "Selecting a blend equation not possible" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

            warned = true;
        }
    }

    m_cache.lastBlendMode = mode;
}